

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O2

deFile * deFile_create(char *filename,deUint32 mode)

{
  uint uVar1;
  deFile *pdVar2;
  
  uVar1 = open(filename,((mode & 0x20) << 4 | mode >> 2 & 1) + (mode & 0x18) * 8 ^ 0x80,0x1ff);
  if (-1 < (int)uVar1) {
    pdVar2 = deFile_createFromHandle((ulong)uVar1);
    return pdVar2;
  }
  return (deFile *)0x0;
}

Assistant:

deFile* deFile_create (const char* filename, deUint32 mode)
{
	int fd = open(filename, mapOpenMode(mode), 0777);
	if (fd >= 0)
		return deFile_createFromHandle((deUintptr)fd);
	else
		return DE_NULL;
}